

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function.hpp
# Opt level: O1

AggregateFunction * __thiscall
duckdb::AggregateFunction::
BinaryAggregate<duckdb::ArgMinMaxState<short,long>,short,long,short,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,(duckdb::AggregateDestructorType)1>
          (AggregateFunction *__return_storage_ptr__,AggregateFunction *this,LogicalType *a_type,
          LogicalType *b_type,LogicalType *return_type)

{
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_71;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_70;
  LogicalType local_58 [2];
  
  LogicalType::LogicalType(local_58,(LogicalType *)this);
  LogicalType::LogicalType(local_58 + 1,a_type);
  __l._M_len = 2;
  __l._M_array = local_58;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_70,__l,&local_71);
  AggregateFunction(__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_70,b_type,
                    StateSize<duckdb::ArgMinMaxState<short,long>>,
                    StateInitialize<duckdb::ArgMinMaxState<short,long>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,(duckdb::AggregateDestructorType)1>
                    ,
                    BinaryScatterUpdate<duckdb::ArgMinMaxState<short,long>,short,long,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
                    ,
                    StateCombine<duckdb::ArgMinMaxState<short,long>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
                    ,
                    StateFinalize<duckdb::ArgMinMaxState<short,long>,short,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
                    ,
                    BinaryUpdate<duckdb::ArgMinMaxState<short,long>,short,long,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
                    ,(bind_aggregate_function_t)0x0,(aggregate_destructor_t)0x0,
                    (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
                    (aggregate_deserialize_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_70);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_58[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

static AggregateFunction BinaryAggregate(const LogicalType &a_type, const LogicalType &b_type,
	                                         LogicalType return_type) {
		return AggregateFunction({a_type, b_type}, return_type, AggregateFunction::StateSize<STATE>,
		                         AggregateFunction::StateInitialize<STATE, OP, destructor_type>,
		                         AggregateFunction::BinaryScatterUpdate<STATE, A_TYPE, B_TYPE, OP>,
		                         AggregateFunction::StateCombine<STATE, OP>,
		                         AggregateFunction::StateFinalize<STATE, RESULT_TYPE, OP>,
		                         AggregateFunction::BinaryUpdate<STATE, A_TYPE, B_TYPE, OP>);
	}